

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::anon_unknown_34::BrokenPipeline::getPipelinedCap
          (BrokenPipeline *this,ArrayPtr<const_capnp::PipelineOp> ops)

{
  _func_int **pp_Var1;
  ClientHook *extraout_RDX;
  Refcounted *refcounted;
  Own<capnp::ClientHook,_std::nullptr_t> OVar2;
  
  pp_Var1 = (_func_int **)operator_new(0x1b8);
  *pp_Var1 = (_func_int *)&PTR___cxa_pure_virtual_0037af80;
  pp_Var1[1] = (_func_int *)&ClientHook::BROKEN_CAPABILITY_BRAND;
  capnp::_::setGlobalBrokenCapFactoryForLayoutCpp
            ((BrokenCapFactory *)&(anonymous_namespace)::brokenCapFactory);
  *(undefined4 *)(pp_Var1 + 3) = 0;
  *pp_Var1 = (_func_int *)&PTR_newCall_0037b1c8;
  pp_Var1[2] = (_func_int *)&DAT_0037b218;
  kj::Exception::Exception((Exception *)(pp_Var1 + 4),(Exception *)(ops.ptr + 3));
  *(undefined1 *)(pp_Var1 + 0x36) = 0;
  *(int *)(pp_Var1 + 3) = *(int *)(pp_Var1 + 3) + 1;
  (this->super_PipelineHook)._vptr_PipelineHook = pp_Var1 + 2;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = pp_Var1;
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

kj::Own<ClientHook> BrokenPipeline::getPipelinedCap(kj::ArrayPtr<const PipelineOp> ops) {
  return kj::refcounted<BrokenClient>(exception, false, &ClientHook::BROKEN_CAPABILITY_BRAND);
}